

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_sah_builder.h
# Opt level: O2

optional<unsigned_long> __thiscall
bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::try_split
          (SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,BBox *bbox,size_t begin,
          size_t end)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  byte bVar2;
  Config *pCVar3;
  pointer puVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  ulong extraout_RDX;
  ulong uVar8;
  ulong extraout_RDX_00;
  undefined8 uVar9;
  size_t axis;
  size_t sVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  size_t i_1;
  ulong uVar12;
  size_t i;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM4 [16];
  reference rVar16;
  optional<unsigned_long> oVar17;
  Split best_split;
  undefined8 local_40;
  float local_38;
  
  pCVar3 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  uVar7 = end - begin;
  sVar10 = 0;
  fVar5 = (bbox->max).values[0] - (bbox->min).values[0];
  fVar6 = (bbox->max).values[1] - (bbox->min).values[1];
  uVar12 = begin + 1 + end >> 1;
  bVar2 = (byte)(pCVar3->sah).log_cluster_size_;
  uVar8 = CONCAT71((int7)(uVar7 >> 8),bVar2);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),
                            ZEXT416((uint)((bbox->max).values[2] - (bbox->min).values[2])),
                            ZEXT416((uint)(fVar5 + fVar6)));
  auVar14 = vcvtusi2ss_avx512f(in_XMM4,(pCVar3->sah).prim_offset_ + uVar7 >> ((ulong)bVar2 & 0x3f));
  fVar5 = auVar15._0_4_ * (auVar14._0_4_ - (pCVar3->sah).cost_ratio_);
  best_split.axis = 0;
  best_split.pos = uVar12;
  best_split.cost = fVar5;
  for (; sVar10 != 3; sVar10 = sVar10 + 1) {
    find_best_split(this,sVar10,begin,end,&best_split);
    uVar8 = extraout_RDX;
  }
  if (fVar5 <= best_split.cost) {
    best_split.pos =
         (size_t)(this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
    if (uVar7 <= *(size_t *)(best_split.pos + 0x20)) {
      uVar9 = 0;
      goto LAB_0010c1ab;
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(bbox->min).values;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(bbox->max).values;
    auVar15 = vsubps_avx(auVar15,auVar14);
    local_38 = (bbox->max).values[2] - (bbox->min).values[2];
    auVar14 = vmovshdup_avx(auVar15);
    local_40 = vmovlps_avx(auVar15);
    uVar7 = (ulong)(auVar15._0_4_ < auVar14._0_4_);
    best_split.pos = uVar12;
    best_split.axis = 2;
    if (local_38 <= *(float *)((long)&local_40 + uVar7 * 4)) {
      best_split.axis = uVar7;
    }
  }
  sVar10 = best_split.pos;
  pvVar1 = this->prim_ids_ + best_split.axis;
  pvVar11 = this->prim_ids_;
  for (sVar13 = begin; sVar13 < sVar10; sVar13 = sVar13 + 1) {
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->marks_,
                        (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[sVar13]);
    uVar8 = rVar16._M_mask;
    *rVar16._M_p = *rVar16._M_p | uVar8;
  }
  for (; sVar10 < end; sVar10 = sVar10 + 1) {
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->marks_,
                        (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[sVar10]);
    uVar8 = ~rVar16._M_mask;
    *rVar16._M_p = *rVar16._M_p & uVar8;
  }
  for (sVar10 = 0; sVar10 != 3; sVar10 = sVar10 + 1) {
    if (sVar10 != best_split.axis) {
      puVar4 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::
      __stable_partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar4 + begin),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar4 + end),
                 (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:135:17)>
                  )this);
      uVar8 = extraout_RDX_00;
    }
    pvVar11 = pvVar11 + 1;
  }
  uVar9 = CONCAT71((int7)(uVar8 >> 8),1);
LAB_0010c1ab:
  oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar9;
  oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = best_split.pos;
  return (optional<unsigned_long>)
         oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        // Find the best split over all axes
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        auto best_split = Split { (begin + end + 1) / 2, leaf_cost, 0 };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, begin, end, best_split);

        // Make sure that the split is good before proceeding with it
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;

            // If the number of primitives is too high, fallback on a split at the
            // median on the largest axis.
            best_split.pos = (begin + end + 1) / 2;
            best_split.axis = bbox.get_diagonal().get_largest_axis();
        }

        // Partition primitives (keeping the order intact so that the next recursive calls do not
        // need to sort primitives again).
        mark_primitives(best_split.axis, begin, best_split.pos, end);
        for (size_t axis = 0; axis < Node::dimension; ++axis) {
            if (axis == best_split.axis)
                continue;
            std::stable_partition(
                prim_ids_[axis].begin() + begin,
                prim_ids_[axis].begin() + end,
                [&] (size_t i) { return marks_[i]; });
        }

        return std::make_optional(best_split.pos);
    }